

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jsoncpp.cpp
# Opt level: O0

bool __thiscall Json::Reader::readValue(Reader *this)

{
  bool bVar1;
  ulong uVar2;
  Value *pVVar3;
  allocator local_111;
  string local_110;
  Value local_f0;
  Value local_c8;
  Value local_a0;
  Value local_68;
  long local_40;
  size_t lastNonNewline;
  undefined1 local_30 [7];
  bool successful;
  Token token;
  Reader *this_local;
  
  token.end_ = (Location)this;
  skipCommentTokens(this,(Token *)local_30);
  lastNonNewline._7_1_ = 1;
  if (((this->collectComments_ & 1U) != 0) &&
     (uVar2 = std::__cxx11::string::empty(), (uVar2 & 1) == 0)) {
    local_40 = std::__cxx11::string::find_last_not_of((char *)&this->commentsBefore_,0x14da35);
    if (local_40 == -1) {
      std::__cxx11::string::clear();
    }
    else {
      std::__cxx11::string::erase((ulong)&this->commentsBefore_,local_40 + 1);
    }
    pVVar3 = currentValue(this);
    Value::setComment(pVVar3,&this->commentsBefore_,commentBefore);
    std::__cxx11::string::operator=((string *)&this->commentsBefore_,"");
  }
  switch(local_30._0_4_) {
  case 1:
    lastNonNewline._7_1_ = readObject(this,(Token *)local_30);
    pVVar3 = currentValue(this);
    Value::setOffsetLimit(pVVar3,(long)this->current_ - (long)this->begin_);
    break;
  default:
switchD_00109da3_caseD_2:
    pVVar3 = currentValue(this);
    Value::setOffsetStart(pVVar3,token._0_8_ - (long)this->begin_);
    pVVar3 = currentValue(this);
    Value::setOffsetLimit(pVVar3,(long)token.start_ - (long)this->begin_);
    std::allocator<char>::allocator();
    std::__cxx11::string::string
              ((string *)&local_110,"Syntax error: value, object or array expected.",&local_111);
    bVar1 = addError(this,&local_110,(Token *)local_30,(Location)0x0);
    std::__cxx11::string::~string((string *)&local_110);
    std::allocator<char>::~allocator((allocator<char> *)&local_111);
    return bVar1;
  case 3:
    lastNonNewline._7_1_ = readArray(this,(Token *)local_30);
    pVVar3 = currentValue(this);
    Value::setOffsetLimit(pVVar3,(long)this->current_ - (long)this->begin_);
    break;
  case 5:
    lastNonNewline._7_1_ = decodeString(this,(Token *)local_30);
    break;
  case 6:
    lastNonNewline._7_1_ = decodeNumber(this,(Token *)local_30);
    break;
  case 7:
    Value::Value(&local_68,true);
    pVVar3 = currentValue(this);
    Value::operator=(pVVar3,&local_68);
    Value::~Value(&local_68);
    pVVar3 = currentValue(this);
    Value::setOffsetStart(pVVar3,token._0_8_ - (long)this->begin_);
    pVVar3 = currentValue(this);
    Value::setOffsetLimit(pVVar3,(long)token.start_ - (long)this->begin_);
    break;
  case 8:
    Value::Value(&local_a0,false);
    pVVar3 = currentValue(this);
    Value::operator=(pVVar3,&local_a0);
    Value::~Value(&local_a0);
    pVVar3 = currentValue(this);
    Value::setOffsetStart(pVVar3,token._0_8_ - (long)this->begin_);
    pVVar3 = currentValue(this);
    Value::setOffsetLimit(pVVar3,(long)token.start_ - (long)this->begin_);
    break;
  case 9:
    Value::Value(&local_c8,nullValue);
    pVVar3 = currentValue(this);
    Value::operator=(pVVar3,&local_c8);
    Value::~Value(&local_c8);
    pVVar3 = currentValue(this);
    Value::setOffsetStart(pVVar3,token._0_8_ - (long)this->begin_);
    pVVar3 = currentValue(this);
    Value::setOffsetLimit(pVVar3,(long)token.start_ - (long)this->begin_);
    break;
  case 10:
    if (((this->features_).allowDroppedNullPlaceholders_ & 1U) == 0) goto switchD_00109da3_caseD_2;
    this->current_ = this->current_ + -1;
    Value::Value(&local_f0,nullValue);
    pVVar3 = currentValue(this);
    Value::operator=(pVVar3,&local_f0);
    Value::~Value(&local_f0);
    pVVar3 = currentValue(this);
    Value::setOffsetStart(pVVar3,(size_t)(this->current_ + (-1 - (long)this->begin_)));
    pVVar3 = currentValue(this);
    Value::setOffsetLimit(pVVar3,(long)this->current_ - (long)this->begin_);
  }
  if ((this->collectComments_ & 1U) != 0) {
    this->lastValueEnd_ = this->current_;
    pVVar3 = currentValue(this);
    this->lastValue_ = pVVar3;
  }
  return (bool)(lastNonNewline._7_1_ & 1);
}

Assistant:

bool Reader::readValue() {
  Token token;
  skipCommentTokens(token);
  bool successful = true;

  if (collectComments_ && !commentsBefore_.empty()) {
    // Remove newline characters at the end of the comments
    size_t lastNonNewline = commentsBefore_.find_last_not_of("\r\n");
    if (lastNonNewline != std::string::npos) {
      commentsBefore_.erase(lastNonNewline + 1);
    } else {
      commentsBefore_.clear();
    }

    currentValue().setComment(commentsBefore_, commentBefore);
    commentsBefore_ = "";
  }

  switch (token.type_) {
  case tokenObjectBegin:
    successful = readObject(token);
    currentValue().setOffsetLimit(current_ - begin_);
    break;
  case tokenArrayBegin:
    successful = readArray(token);
    currentValue().setOffsetLimit(current_ - begin_);
    break;
  case tokenNumber:
    successful = decodeNumber(token);
    break;
  case tokenString:
    successful = decodeString(token);
    break;
  case tokenTrue:
    currentValue() = true;
    currentValue().setOffsetStart(token.start_ - begin_);
    currentValue().setOffsetLimit(token.end_ - begin_);
    break;
  case tokenFalse:
    currentValue() = false;
    currentValue().setOffsetStart(token.start_ - begin_);
    currentValue().setOffsetLimit(token.end_ - begin_);
    break;
  case tokenNull:
    currentValue() = Value();
    currentValue().setOffsetStart(token.start_ - begin_);
    currentValue().setOffsetLimit(token.end_ - begin_);
    break;
  case tokenArraySeparator:
    if (features_.allowDroppedNullPlaceholders_) {
      // "Un-read" the current token and mark the current value as a null
      // token.
      current_--;
      currentValue() = Value();
      currentValue().setOffsetStart(current_ - begin_ - 1);
      currentValue().setOffsetLimit(current_ - begin_);
      break;
    }
  // Else, fall through...
  default:
    currentValue().setOffsetStart(token.start_ - begin_);
    currentValue().setOffsetLimit(token.end_ - begin_);
    return addError("Syntax error: value, object or array expected.", token);
  }

  if (collectComments_) {
    lastValueEnd_ = current_;
    lastValue_ = &currentValue();
  }

  return successful;
}